

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O0

char * extract_word(char **ptr)

{
  char *pcVar1;
  ushort **ppuVar2;
  bool bVar3;
  char *start;
  char *p;
  char **ptr_local;
  
  start = *ptr;
  while( true ) {
    pcVar1 = start;
    bVar3 = false;
    if (*start != '\0') {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)(uint)(byte)*start] & 0x2000) != 0;
    }
    if (!bVar3) break;
    start = start + 1;
  }
  while( true ) {
    bVar3 = false;
    if (*start != '\0') {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)(uint)(byte)*start] & 0x2000) == 0;
    }
    if (!bVar3) break;
    start = start + 1;
  }
  if (*start != '\0') {
    *start = '\0';
    do {
      start = start + 1;
      bVar3 = false;
      if (*start != '\0') {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)(uint)(byte)*start] & 0x2000) != 0;
      }
    } while (bVar3);
  }
  *ptr = start;
  return pcVar1;
}

Assistant:

static const char *extract_word(char **ptr)
{
    char *p = *ptr;
    while (*p && isspace((unsigned char)*p)) p++;

    char *start = p;
    while (*p && !isspace((unsigned char)*p)) p++;

    if (*p) {
        *p++ = '\0';
        while (*p && isspace((unsigned char)*p)) p++;
    }

    *ptr = p;
    return start;
}